

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O1

char Ver_StreamPopChar(Ver_Stream_t *p)

{
  char *pcVar1;
  char cVar2;
  
  if (p->fStop == 0) {
    if (p->pBufferStop < p->pBufferCur) {
      Ver_StreamReload(p);
    }
    pcVar1 = p->pBufferCur;
    if (pcVar1 == p->pBufferEnd) {
      p->fStop = 1;
      cVar2 = -1;
    }
    else {
      if (*pcVar1 == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      p->pBufferCur = pcVar1 + 1;
      cVar2 = *pcVar1;
    }
    return cVar2;
  }
  __assert_fail("!p->fStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verStream.c"
                ,0x115,"char Ver_StreamPopChar(Ver_Stream_t *)");
}

Assistant:

char Ver_StreamPopChar( Ver_Stream_t * p )
{
    assert( !p->fStop );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // check if there are symbols left
    if ( p->pBufferCur == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return -1;
    }
    // count the lines
    if ( *p->pBufferCur == '\n' )
        p->nLineCounter++;
    return *p->pBufferCur++;
}